

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interfaces.cpp
# Opt level: O2

unique_ptr<interfaces::Handler,_std::default_delete<interfaces::Handler>_> __thiscall
wallet::anon_unknown_5::WalletImpl::handleStatusChanged(WalletImpl *this,StatusChangedFn fn)

{
  undefined8 uVar1;
  function<void_()> *this_00;
  function<void_()> *in_RDX;
  weak_count extraout_RDX;
  long in_RSI;
  long in_FS_OFFSET;
  connection connection;
  function<void_()> fStack_198;
  slot<void_(wallet::CWallet_*),_boost::function<void_(wallet::CWallet_*)>_> local_178;
  undefined1 local_140 [16];
  function<void_()> local_130;
  function<void_()> local_110;
  function1<void,_wallet::CWallet_*> local_f0;
  function<void_()> local_d0;
  function<void_()> local_b0;
  function<void_()> local_90;
  function<void_()> local_70;
  function<void_()> local_50;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  uVar1 = *(undefined8 *)(in_RSI + 0x10);
  _GLOBAL__N_1::std::function<void_()>::function(&fStack_198,in_RDX);
  local_178.super_slot_base._tracked_objects.
  super__Vector_base<boost::variant<boost::weak_ptr<boost::signals2::detail::trackable_pointee>,_boost::weak_ptr<void>,_boost::signals2::detail::foreign_void_weak_ptr>,_std::allocator<boost::variant<boost::weak_ptr<boost::signals2::detail::trackable_pointee>,_boost::weak_ptr<void>,_boost::signals2::detail::foreign_void_weak_ptr>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_178._slot_function.super_function1<void,_wallet::CWallet_*>.super_function_base.vtable =
       (vtable_base *)0x0;
  local_178.super_slot_base._tracked_objects.
  super__Vector_base<boost::variant<boost::weak_ptr<boost::signals2::detail::trackable_pointee>,_boost::weak_ptr<void>,_boost::signals2::detail::foreign_void_weak_ptr>,_std::allocator<boost::variant<boost::weak_ptr<boost::signals2::detail::trackable_pointee>,_boost::weak_ptr<void>,_boost::signals2::detail::foreign_void_weak_ptr>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_178.super_slot_base._tracked_objects.
  super__Vector_base<boost::variant<boost::weak_ptr<boost::signals2::detail::trackable_pointee>,_boost::weak_ptr<void>,_boost::signals2::detail::foreign_void_weak_ptr>,_std::allocator<boost::variant<boost::weak_ptr<boost::signals2::detail::trackable_pointee>,_boost::weak_ptr<void>,_boost::signals2::detail::foreign_void_weak_ptr>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  _GLOBAL__N_1::std::function<void_()>::function
            ((function<void_()> *)(local_140 + 0x10),&fStack_198);
  _GLOBAL__N_1::std::function<void_()>::function(&local_110,(function<void_()> *)(local_140 + 0x10))
  ;
  _GLOBAL__N_1::std::function<void_()>::function(&local_d0,&local_110);
  local_f0.super_function_base.vtable = (vtable_base *)0x0;
  _GLOBAL__N_1::std::function<void_()>::function(&local_b0,&local_d0);
  _GLOBAL__N_1::std::function<void_()>::function(&local_90,&local_b0);
  _GLOBAL__N_1::std::function<void_()>::function(&local_70,&local_90);
  _GLOBAL__N_1::std::function<void_()>::function(&local_50,&local_70);
  this_00 = (function<void_()> *)operator_new(0x20);
  _GLOBAL__N_1::std::function<void_()>::function(this_00,&local_50);
  local_f0.super_function_base.functor.members._0_8_ = (undefined8)this_00;
  std::_Function_base::~_Function_base((_Function_base *)&local_50);
  std::_Function_base::~_Function_base((_Function_base *)&local_70);
  std::_Function_base::~_Function_base((_Function_base *)&local_90);
  local_f0.super_function_base.vtable =
       (vtable_base *)
       boost::function1<void,wallet::CWallet*>::
       assign_to<wallet::(anonymous_namespace)::WalletImpl::handleStatusChanged(std::function<void()>)::{lambda(wallet::CWallet*)#1}>(wallet::(anonymous_namespace)::WalletImpl::handleStatusChanged(std::function<void()>)::{lambda(wallet::CWallet*)#1})
       ::stored_vtable;
  std::_Function_base::~_Function_base((_Function_base *)&local_b0);
  std::_Function_base::~_Function_base((_Function_base *)&local_d0);
  boost::function1<void,_wallet::CWallet_*>::swap
            (&local_f0,&local_178._slot_function.super_function1<void,_wallet::CWallet_*>);
  boost::function1<void,_wallet::CWallet_*>::~function1(&local_f0);
  std::_Function_base::~_Function_base((_Function_base *)&local_110);
  std::_Function_base::~_Function_base((_Function_base *)(local_140 + 0x10));
  boost::signals2::
  signal<void_(wallet::CWallet_*),_boost::signals2::optional_last_value<void>,_int,_std::less<int>,_boost::function<void_(wallet::CWallet_*)>,_boost::function<void_(const_boost::signals2::connection_&,_wallet::CWallet_*)>,_boost::signals2::mutex>
  ::connect((signal<void_(wallet::CWallet_*),_boost::signals2::optional_last_value<void>,_int,_std::less<int>,_boost::function<void_(wallet::CWallet_*)>,_boost::function<void_(const_boost::signals2::connection_&,_wallet::CWallet_*)>,_boost::signals2::mutex>
             *)local_140,(int)uVar1 + 0x490,(sockaddr *)&local_178,0);
  connection._weak_connection_body.pn.pi_ = extraout_RDX.pi_;
  connection._weak_connection_body.px = (element_type *)local_140;
  interfaces::MakeSignalHandler((interfaces *)this,connection);
  boost::detail::weak_count::~weak_count((weak_count *)(local_140 + 8));
  boost::signals2::slot<void_(wallet::CWallet_*),_boost::function<void_(wallet::CWallet_*)>_>::~slot
            (&local_178);
  std::_Function_base::~_Function_base((_Function_base *)&fStack_198);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return (__uniq_ptr_data<interfaces::Handler,_std::default_delete<interfaces::Handler>,_true,_true>
            )(__uniq_ptr_data<interfaces::Handler,_std::default_delete<interfaces::Handler>,_true,_true>
              )this;
  }
  __stack_chk_fail();
}

Assistant:

std::unique_ptr<Handler> handleStatusChanged(StatusChangedFn fn) override
    {
        return MakeSignalHandler(m_wallet->NotifyStatusChanged.connect([fn](CWallet*) { fn(); }));
    }